

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

int __thiscall asl::File::open(File *this,char *__file,int __oflag,...)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  OpenMode OVar4;
  undefined7 extraout_var;
  char *__filename;
  FILE *pFVar5;
  undefined7 uVar6;
  undefined1 local_41;
  int local_30;
  char local_2c [4];
  int i;
  char fopen_mode [8];
  OpenMode mode_local;
  String *name_local;
  File *this_local;
  
  fopen_mode._0_4_ = __oflag;
  unique0x1000018c = (String *)__file;
  bVar3 = asl::String::operator==((String *)__file,"");
  uVar1 = fopen_mode._0_4_;
  if (bVar3) {
    this_local._7_1_ = false;
    uVar6 = extraout_var;
  }
  else {
    OVar4 = operator|(READ,WRITE);
    OVar4 = operator|(OVar4,APPEND);
    OVar4 = operator|(OVar4,RW);
    uVar2 = fopen_mode._0_4_;
    if ((uVar1 & OVar4) == WRITE) {
      local_2c[0] = 'w';
    }
    else if ((uVar1 & OVar4) == APPEND) {
      local_2c[0] = 'a';
    }
    else {
      local_2c[0] = 'r';
    }
    local_41 = 0x74;
    if ((fopen_mode._0_4_ & 8) == 0) {
      local_41 = 0x62;
    }
    local_30 = 2;
    local_2c[1] = local_41;
    OVar4 = operator|(READ,WRITE);
    OVar4 = operator|(OVar4,APPEND);
    OVar4 = operator|(OVar4,RW);
    if ((uVar2 & OVar4) == RW) {
      local_30 = 3;
      local_2c[2] = 0x2b;
    }
    if ((fopen_mode._0_4_ & 4) != 0) {
      local_2c[local_30] = 'x';
      local_30 = local_30 + 1;
    }
    local_2c[local_30] = '\0';
    __filename = asl::String::operator_cast_to_char_(stack0xffffffffffffffe0);
    pFVar5 = fopen(__filename,local_2c);
    this->_file = (FILE *)pFVar5;
    asl::String::operator=(&this->_path,stack0xffffffffffffffe0);
    this_local._7_1_ = this->_file != (FILE *)0x0;
    uVar6 = (undefined7)((ulong)this >> 8);
  }
  return (int)CONCAT71(uVar6,this_local._7_1_);
}

Assistant:

bool File::open(const String& name, File::OpenMode mode)
{
	if(name == "")
		return false;
	CHART fopen_mode[8];
	int   i = 0;
	switch (mode & (READ | WRITE | APPEND | RW))
	{
	case WRITE:
		fopen_mode[i++] = STR_PREFIX('w');
		break;
	case APPEND:
		fopen_mode[i++] = STR_PREFIX('a');
		break;
	default:
		fopen_mode[i++] = STR_PREFIX('r');
		break;
	}

	fopen_mode[i++] = (mode & TEXT) ? STR_PREFIX('t') : STR_PREFIX('b');

	if ((mode & (READ | WRITE | APPEND | RW)) == RW)
		fopen_mode[i++] = STR_PREFIX('+');

#if !defined _MSC_VER || _MSC_VER >= 1900
	if (mode & CREATE)
		fopen_mode[i++] = STR_PREFIX('x');
#endif

	fopen_mode[i] = 0;

	_file = fopenX(name, fopen_mode);

	_path = name;

	return _file != 0;
}